

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

int wally_secp_randomize(uchar *bytes,size_t bytes_len)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  
  iVar1 = -2;
  if (bytes_len == 0x20 && bytes != (uchar *)0x0) {
    ctx = (*_ops.secp_context_fn)();
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = secp256k1_context_randomize(ctx,bytes);
      iVar1 = -(uint)(iVar1 == 0);
    }
  }
  return iVar1;
}

Assistant:

int wally_secp_randomize(const unsigned char *bytes, size_t bytes_len)
{
    secp256k1_context *ctx;

    if (!bytes || bytes_len != WALLY_SECP_RANDOMIZE_LEN)
        return WALLY_EINVAL;

    if (!(ctx = (secp256k1_context *)secp_ctx()))
        return WALLY_ENOMEM;

    if (!secp256k1_context_randomize(ctx, bytes))
        return WALLY_ERROR;

    return WALLY_OK;
}